

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load_raw<char>(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *this,enable_if_t<std::is_same<char,_char>::value,_handle> src)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (((src.m_ptr)->ob_type->tp_flags & 0x8000000) == 0) {
    iVar1 = _PyObject_TypeCheck(src.m_ptr,(PyTypeObject *)&PyByteArray_Type);
    if (iVar1 == 0) {
      return false;
    }
    lVar2 = PyByteArray_AsString(src.m_ptr);
    if (lVar2 == 0) {
      pybind11_fail("Unexpected PyByteArray_AsString() failure.");
    }
    lVar3 = PyByteArray_Size(src.m_ptr);
  }
  else {
    lVar2 = PyBytes_AsString(src.m_ptr);
    if (lVar2 == 0) {
      pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
    }
    lVar3 = PyBytes_Size(src.m_ptr);
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,lVar2,lVar2 + lVar3);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return true;
}

Assistant:

bool load_raw(enable_if_t<std::is_same<C, char>::value, handle> src) {
        if (PYBIND11_BYTES_CHECK(src.ptr())) {
            // We were passed raw bytes; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytes = PYBIND11_BYTES_AS_STRING(src.ptr());
            if (!bytes) {
                pybind11_fail("Unexpected PYBIND11_BYTES_AS_STRING() failure.");
            }
            value = StringType(bytes, (size_t) PYBIND11_BYTES_SIZE(src.ptr()));
            return true;
        }
        if (PyByteArray_Check(src.ptr())) {
            // We were passed a bytearray; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytearray = PyByteArray_AsString(src.ptr());
            if (!bytearray) {
                pybind11_fail("Unexpected PyByteArray_AsString() failure.");
            }
            value = StringType(bytearray, (size_t) PyByteArray_Size(src.ptr()));
            return true;
        }

        return false;
    }